

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O1

void __thiscall logfault::Handler::PrintMessage(Handler *this,ostream *out,Message *msg)

{
  long lVar1;
  undefined1 auVar2 [16];
  basic_ostream<char,_std::char_traits<char>_> bVar3;
  tm *ptVar4;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  string *psVar7;
  pthread_t pVar8;
  long lVar9;
  _Put_time<char> __f;
  _Put_time<char> __f_00;
  time_t tt;
  char local_3b [3];
  long local_38;
  
  lVar1 = (msg->when_).__d.__r;
  local_38 = lVar1 / 1000000000;
  lVar9 = local_38 * 1000000000;
  if (SBORROW8(lVar1,lVar9) != lVar1 % 1000000000 < 0) {
    local_38 = local_38 + -1;
    lVar9 = lVar9 + -1000000000;
  }
  ptVar4 = localtime(&local_38);
  if (ptVar4 == (tm *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"0000-00-00 00:00:00.000",0x17);
  }
  else {
    auVar2 = SEXT816((msg->when_).__d.__r - lVar9) * SEXT816(0x431bde82d7b634db);
    __f._M_fmt = "%Y-%m-%d %H:%M:%S.";
    __f._M_tmb = (tm *)ptVar4;
    this_00 = std::operator<<(out,__f);
    lVar1 = *(long *)this_00;
    *(undefined8 *)(this_00 + *(long *)(lVar1 + -0x18) + 0x10) = 3;
    lVar1 = *(long *)(lVar1 + -0x18);
    pbVar5 = this_00 + lVar1;
    if (this_00[lVar1 + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x0) {
      bVar3 = (basic_ostream<char,_std::char_traits<char>_>)std::ios::widen((char)pbVar5);
      pbVar5[0xe0] = bVar3;
      pbVar5[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
    }
    pbVar5[0xe0] = (basic_ostream<char,_std::char_traits<char>_>)0x30;
    pbVar5 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<
                       ((ostream *)this_00,(int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f));
    __f_00._M_fmt = " %Z";
    __f_00._M_tmb = (tm *)ptVar4;
    std::operator<<(pbVar5,__f_00);
  }
  local_3b[0] = ' ';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,local_3b,1);
  psVar7 = LevelName_abi_cxx11_(msg->level_);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
  local_3b[1] = 0x20;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3b + 1,1);
  pVar8 = pthread_self();
  if (pVar8 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"thread::id of a non-executing thread",0x24);
  }
  else {
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  }
  local_3b[2] = 0x20;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3b + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(msg->msg_)._M_dataplus._M_p,(msg->msg_)._M_string_length);
  return;
}

Assistant:

void PrintMessage(std::ostream& out, const logfault::Message& msg) {
            auto tt = std::chrono::system_clock::to_time_t(msg.when_);
            auto when_rounded = std::chrono::system_clock::from_time_t(tt);
            if (when_rounded > msg.when_) {
                --tt;
                when_rounded -= std::chrono::seconds(1);
            }
            if (const auto tm = (LOGFAULT_USE_UTCZONE ? std::gmtime(&tt) : std::localtime(&tt))) {
                const int ms = std::chrono::duration_cast<std::chrono::duration<int, std::milli>>(msg.when_ - when_rounded).count();

                out << std::put_time(tm, LOGFAULT_TIME_FORMAT)
#if LOGFAULT_TIME_PRINT_MILLISECONDS
                    << std::setw(3) << std::setfill('0') << ms
#endif
#if LOGFAULT_TIME_PRINT_TIMEZONE
#   if LOGFAULT_USE_UTCZONE
                    << " UTC";
#   else
                    << std::put_time(tm, " %Z")
#   endif
#endif
                    ;
            } else {
                out << "0000-00-00 00:00:00.000";
            }

            out << ' ' << LevelName(msg.level_)
                << ' ' << LOGFAULT_THREAD_NAME
                << ' ' << msg.msg_;
        }